

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool SQVM::IsFalse(SQObjectPtr *o)

{
  return (o->super_SQObject)._unVal.pTable == (SQTable *)0x0 ||
         (o->super_SQObject)._unVal.fFloat == 0.0 && (o->super_SQObject)._type == OT_FLOAT;
}

Assistant:

bool SQVM::IsFalse(const SQObjectPtr &o)
{
    if(((sq_type(o) & SQOBJECT_CANBEFALSE)
        && ( ((sq_type(o) == OT_FLOAT) && (_float(o) == SQFloat(0.0))) ))
#if !defined(SQUSEDOUBLE) || (defined(SQUSEDOUBLE) && defined(_SQ64))
        || (_integer(o) == 0) )  //OT_NULL|OT_INTEGER|OT_BOOL
#else
        || (((sq_type(o) != OT_FLOAT) && (_integer(o) == 0))) )  //OT_NULL|OT_INTEGER|OT_BOOL
#endif
    {
        return true;
    }
    return false;
}